

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.cpp
# Opt level: O2

char * __thiscall cali::Attribute::name_c_str(Attribute *this)

{
  Node *pNVar1;
  char *pcVar2;
  cali_variant_t local_18;
  
  while( true ) {
    pNVar1 = this->m_node;
    if (pNVar1 == (Node *)0x0) {
      return (char *)0x0;
    }
    if (pNVar1->m_attribute == 8) break;
    this = (Attribute *)
           ((long)&(((pNVar1->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                   super_LockfreeIntrusiveTree<cali::Node>).m_me +
           (pNVar1->super_LockfreeIntrusiveTree<cali::Node>).m_node);
  }
  local_18.type_and_size = (pNVar1->m_data).m_v.type_and_size;
  local_18.value = (pNVar1->m_data).m_v.value;
  pcVar2 = (char *)cali_variant_get_data(&local_18);
  return pcVar2;
}

Assistant:

const char* Attribute::name_c_str() const
{
    for (const Node* node = m_node; node; node = node->parent())
        if (node->attribute() == NAME_ATTR_ID)
            return static_cast<const char*>(node->data().data());

    return nullptr;
}